

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::FindConfig(cmFindPackageCommand *this)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  bool bVar4;
  string help;
  string init;
  string local_68;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  ComputePrefixes(this);
  if (((this->super_cmFindCommon).SearchFrameworkFirst == false) &&
     ((this->super_cmFindCommon).SearchFrameworkOnly != true)) {
    bVar4 = false;
  }
  else {
    psVar3 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = psVar3 != (this->super_cmFindCommon).SearchPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar2 = SearchFrameworkPrefix(this,psVar3);
      while (!bVar2) {
        psVar3 = psVar3 + 1;
        bVar2 = psVar3 == (this->super_cmFindCommon).SearchPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar2;
        if (bVar2) break;
        bVar2 = SearchFrameworkPrefix(this,psVar3);
      }
    }
  }
  if ((bVar4 == false) &&
     (((this->super_cmFindCommon).SearchAppBundleFirst != false ||
      ((this->super_cmFindCommon).SearchAppBundleOnly == true)))) {
    psVar3 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = psVar3 != (this->super_cmFindCommon).SearchPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar2 = SearchAppBundlePrefix(this,psVar3);
      while (!bVar2) {
        psVar3 = psVar3 + 1;
        bVar2 = psVar3 == (this->super_cmFindCommon).SearchPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar2;
        if (bVar2) break;
        bVar2 = SearchAppBundlePrefix(this,psVar3);
      }
    }
  }
  if (((bVar4 == false) && ((this->super_cmFindCommon).SearchFrameworkOnly == false)) &&
     ((this->super_cmFindCommon).SearchAppBundleOnly == false)) {
    psVar3 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = psVar3 != (this->super_cmFindCommon).SearchPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar2 = SearchPrefix(this,psVar3);
      while (!bVar2) {
        psVar3 = psVar3 + 1;
        bVar2 = psVar3 == (this->super_cmFindCommon).SearchPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar2;
        if (bVar2) break;
        bVar2 = SearchPrefix(this,psVar3);
      }
    }
  }
  if ((bVar4 == false) && ((this->super_cmFindCommon).SearchFrameworkLast == true)) {
    psVar3 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = psVar3 != (this->super_cmFindCommon).SearchPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar2 = SearchFrameworkPrefix(this,psVar3);
      while (!bVar2) {
        psVar3 = psVar3 + 1;
        bVar2 = psVar3 == (this->super_cmFindCommon).SearchPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar2;
        if (bVar2) break;
        bVar2 = SearchFrameworkPrefix(this,psVar3);
      }
    }
  }
  if ((bVar4 == false) && ((this->super_cmFindCommon).SearchAppBundleLast == true)) {
    psVar3 = (this->super_cmFindCommon).SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar4 = psVar3 != (this->super_cmFindCommon).SearchPaths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      bVar2 = SearchAppBundlePrefix(this,psVar3);
      while (!bVar2) {
        psVar3 = psVar3 + 1;
        bVar2 = psVar3 == (this->super_cmFindCommon).SearchPaths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = !bVar2;
        if (bVar2) break;
        bVar2 = SearchAppBundlePrefix(this,psVar3);
      }
    }
  }
  local_40 = 0;
  local_38 = '\0';
  local_48 = &local_38;
  if (bVar4 == false) {
    pcVar1 = (this->Variable)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (this->Variable)._M_string_length);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0026832c;
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_68,&this->FileFound);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0026832c;
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
LAB_0026832c:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"The directory containing a CMake configuration file for ","");
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_68);
  cmMakefile::AddCacheDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable,local_48,
             local_68._M_dataplus._M_p,PATH,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return bVar4;
}

Assistant:

bool cmFindPackageCommand::FindConfig()
{
  // Compute the set of search prefixes.
  this->ComputePrefixes();

  // Look for the project's configuration file.
  bool found = false;

  // Search for frameworks.
  if (!found && (this->SearchFrameworkFirst || this->SearchFrameworkOnly)) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && (this->SearchAppBundleFirst || this->SearchAppBundleOnly)) {
    found = this->FindAppBundleConfig();
  }

  // Search prefixes.
  if (!found && !(this->SearchFrameworkOnly || this->SearchAppBundleOnly)) {
    found = this->FindPrefixedConfig();
  }

  // Search for frameworks.
  if (!found && this->SearchFrameworkLast) {
    found = this->FindFrameworkConfig();
  }

  // Search for apps.
  if (!found && this->SearchAppBundleLast) {
    found = this->FindAppBundleConfig();
  }

  // Store the entry in the cache so it can be set by the user.
  std::string init;
  if (found) {
    init = cmSystemTools::GetFilenamePath(this->FileFound);
  } else {
    init = this->Variable + "-NOTFOUND";
  }
  std::string help =
    "The directory containing a CMake configuration file for ";
  help += this->Name;
  help += ".";
  // We force the value since we do not get here if it was already set.
  this->Makefile->AddCacheDefinition(this->Variable, init.c_str(),
                                     help.c_str(), cmStateEnums::PATH, true);
  return found;
}